

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_stream_socket.c
# Opt level: O0

void oonf_stream_remove_managed(oonf_stream_managed *managed,_Bool force)

{
  _Bool force_local;
  oonf_stream_managed *managed_local;
  
  os_interface_linux_remove(&managed->_if_listener);
  oonf_stream_remove(&managed->socket_v4,force);
  oonf_stream_remove(&managed->socket_v6,force);
  os_interface_linux_remove(&managed->_if_listener);
  oonf_stream_free_managed_config(&managed->_managed_config);
  return;
}

Assistant:

void
oonf_stream_remove_managed(struct oonf_stream_managed *managed, bool force) {
  os_interface_remove(&managed->_if_listener);

  oonf_stream_remove(&managed->socket_v4, force);
  oonf_stream_remove(&managed->socket_v6, force);
  os_interface_remove(&managed->_if_listener);
  oonf_stream_free_managed_config(&managed->_managed_config);
}